

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_ps_enum(stb_ps *ps,void *data,_func_int_void_ptr_void_ptr *func)

{
  int iVar1;
  long lVar2;
  
  switch((uint)ps & 3) {
  case 0:
    if (ps != (stb_ps *)0x0) {
      iVar1 = (*func)(ps,data);
      return iVar1;
    }
    break;
  case 1:
    lVar2 = 0;
    do {
      if ((*(void **)(ps + lVar2 * 8 + -1) != (void *)0x0) &&
         (iVar1 = (*func)(*(void **)(ps + lVar2 * 8 + -1),data), iVar1 == 0)) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 2:
    if (*(int *)(ps + -2) < 1) {
      return 1;
    }
    lVar2 = 0;
    do {
      iVar1 = (*func)(*(void **)(ps + lVar2 * 8 + 6),data);
      if (iVar1 == 0) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)(ps + -2));
    return 1;
  case 3:
    if (*(int *)(ps + 5) < 1) {
      return 1;
    }
    lVar2 = 0;
    while ((((ulong)*(void **)(ps + lVar2 * 8 + 0x1d) & 0xfffffffe) == 0 ||
           (iVar1 = (*func)(*(void **)(ps + lVar2 * 8 + 0x1d),data), iVar1 != 0))) {
      lVar2 = lVar2 + 1;
      if (*(int *)(ps + 5) <= lVar2) {
        return 1;
      }
    }
    return 0;
  }
  return 1;
}

Assistant:

int stb_ps_enum(stb_ps *ps, void *data, int (*func)(void *value, void *data))
{
   int i;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL) return STB_TRUE;
         return func(ps, data);
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL)
               if (!func(b->p[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         for (i=0; i < a->count; ++i)
            if (!func(a->p[i], data))
               return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         for (i=0; i < h->count; ++i)
            if (!stb_ps_empty(h->table[i]))
               if (!func(h->table[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
   }
   return STB_TRUE; /* NOTREACHED */
}